

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O2

void __thiscall
Diligent::QueryManagerVk::QueryPoolInfo::Init
          (QueryPoolInfo *this,VulkanLogicalDevice *LogicalDevice,VkQueryPoolCreateInfo *QueryPoolCI
          ,QUERY_TYPE Type)

{
  pointer puVar1;
  ulong uVar2;
  QueryPoolWrapper QStack_28;
  
  this->m_Type = Type;
  this->m_QueryCount = QueryPoolCI->queryCount;
  VulkanUtilities::VulkanLogicalDevice::CreateQueryPool
            (&QStack_28,LogicalDevice,QueryPoolCI,"QueryManagerVk: query pool");
  VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
  operator=(&this->m_vkQueryPool,&QStack_28);
  VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
  ~VulkanObjectWrapper(&QStack_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_StaleQueries,(ulong)this->m_QueryCount);
  puVar1 = (this->m_StaleQueries).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar2 = 0; uVar2 < this->m_QueryCount; uVar2 = uVar2 + 1) {
    puVar1[uVar2] = (uint)uVar2;
  }
  return;
}

Assistant:

void QueryManagerVk::QueryPoolInfo::Init(const VulkanUtilities::VulkanLogicalDevice& LogicalDevice,
                                         const VkQueryPoolCreateInfo&                QueryPoolCI,
                                         QUERY_TYPE                                  Type)
{
    m_Type        = Type;
    m_QueryCount  = QueryPoolCI.queryCount;
    m_vkQueryPool = LogicalDevice.CreateQueryPool(QueryPoolCI, "QueryManagerVk: query pool");

    m_StaleQueries.resize(m_QueryCount);
    for (Uint32 i = 0; i < m_QueryCount; ++i)
        m_StaleQueries[i] = i;
}